

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O3

int cache_get(uint64_t a,uint64_t b,uint64_t c,uint64_t *res)

{
  uint uVar1;
  uint32_t *puVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  cache_entry_t pcVar6;
  
  puVar2 = cache_status;
  uVar5 = (((a >> 0x20 ^ a ^ 0xcbf29ce484222325) * 0x100000001b3 ^ b) * 0x100000001b3 ^ c) *
          0x100000001b3;
  uVar3 = 0;
  uVar4 = cache_mask & uVar5;
  pcVar6 = cache_table + uVar4;
  uVar1 = cache_status[uVar4];
  if ((((uVar1 < 0x40000000) && ((((uint)(uVar5 >> 0x20) ^ uVar1) & 0x3fff0000) == 0)) &&
      (pcVar6->a == a)) && ((pcVar6->b == b && (pcVar6->c == c)))) {
    *res = pcVar6->res;
    uVar3 = (uint)(puVar2[uVar4] == uVar1);
  }
  return uVar3;
}

Assistant:

int
cache_get(uint64_t a, uint64_t b, uint64_t c, uint64_t *res)
{
    const uint64_t hash = cache_hash(a, b, c);
#if CACHE_MASK
    _Atomic(uint32_t) *s_bucket = (_Atomic(uint32_t)*)cache_status + (hash & cache_mask);
    cache_entry_t bucket = cache_table + (hash & cache_mask);
#else
    _Atomic(uint32_t) *s_bucket = (_Atomic(uint32_t)*)cache_status + (hash % cache_size);
    cache_entry_t bucket = cache_table + (hash % cache_size);
#endif
    const uint32_t s = atomic_load_explicit(s_bucket, memory_order_relaxed);
    // abort if locked or if part of a 2-part cache entry
    if (s & 0xc0000000) return 0;
    // abort if different hash
    if ((s ^ (hash>>32)) & 0x3fff0000) return 0;
    // abort if key different
    if (bucket->a != a || bucket->b != b || bucket->c != c) return 0;
    *res = bucket->res;
    // abort if status field changed after compiler_barrier()
    return atomic_load_explicit(s_bucket, memory_order_acquire) == s ? 1 : 0;
}